

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# app_parameters.cpp
# Opt level: O0

void __thiscall
AppParametersTest_path_only_w_Test::AppParametersTest_path_only_w_Test
          (AppParametersTest_path_only_w_Test *this)

{
  AppParametersTest_path_only_w_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  *(undefined ***)this = &PTR__AppParametersTest_path_only_w_Test_00817d00;
  return;
}

Assistant:

TEST(AppParametersTest, path_only_w) {
	ArgWrapper<wchar_t> args{ L"/path/to/exe" };
	app_parameters parameters{ args.argc(), args.argv() };

	EXPECT_EQ(parameters.name(), u8"/path/to/exe");
	EXPECT_TRUE(parameters.arguments().empty());
	EXPECT_TRUE(parameters.switches().empty());
	EXPECT_TRUE(parameters.switches_set().empty());
	EXPECT_TRUE(parameters.values().empty());

	auto obj = parameters.as_object();
	EXPECT_FALSE(obj.null());
	EXPECT_EQ(obj[u8"Name"], u8"/path/to/exe");
}